

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

int __thiscall
google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(CodedInputStream *this)

{
  uint8_t *puVar1;
  int iVar2;
  Nullable<const_char_*> failure_msg;
  uint8_t *puVar3;
  uint8_t local_29;
  uint64_t temp;
  
  puVar3 = this->buffer_;
  puVar1 = this->buffer_end_;
  if (((int)puVar1 - (int)puVar3 < 10) && ((puVar1 <= puVar3 || ((char)puVar1[-1] < '\0')))) {
    iVar2 = ReadVarintSizeAsIntSlow(this);
    return iVar2;
  }
  local_29 = *puVar3;
  temp._0_4_ = 0x80;
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl<unsigned_char,int>
                          (&local_29,(int *)&temp,"buffer[0] >= 128");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&temp,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1da,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&temp);
  }
  if ((char)puVar3[1] < '\0') {
    if ((char)puVar3[2] < '\0') {
      if ((char)puVar3[3] < '\0') {
        if ((char)puVar3[4] < '\0') {
          if ((char)puVar3[5] < '\0') {
            if ((char)puVar3[6] < '\0') {
              if ((char)puVar3[7] < '\0') {
                if ((char)puVar3[8] < '\0') {
                  if ((char)puVar3[9] < '\0') {
                    return -1;
                  }
                  puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>(puVar3,&temp);
                }
                else {
                  puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<9ul>(puVar3,&temp);
                }
              }
              else {
                puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<8ul>(puVar3,&temp);
              }
            }
            else {
              puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<7ul>(puVar3,&temp);
            }
          }
          else {
            puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<6ul>(puVar3,&temp);
          }
        }
        else {
          puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<5ul>(puVar3,&temp);
        }
      }
      else {
        puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<4ul>(puVar3,&temp);
      }
    }
    else {
      puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<3ul>(puVar3,&temp);
    }
  }
  else {
    puVar3 = io::(anonymous_namespace)::DecodeVarint64KnownSize<2ul>(puVar3,&temp);
  }
  iVar2 = -1;
  if (CONCAT44(temp._4_4_,(int)temp) < 0x80000000) {
    this->buffer_ = puVar3;
    iVar2 = (int)temp;
  }
  return iVar2;
}

Assistant:

int CodedInputStream::ReadVarintSizeAsIntFallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first || temp > static_cast<uint64_t>(INT_MAX)) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    return ReadVarintSizeAsIntSlow();
  }
}